

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_token.c
# Opt level: O0

int get_next_token(STRING_TOKEN *token,char **delimiters,size_t n_delims)

{
  char *pcVar1;
  size_t *__ptr;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  size_t sVar4;
  ulong local_60;
  size_t k;
  size_t j;
  char *stop_pos;
  char *current_pos;
  char *new_token_start;
  LOGGER_LOG l;
  size_t *delimiters_lengths;
  int result;
  size_t n_delims_local;
  char **delimiters_local;
  STRING_TOKEN *token_local;
  
  if ((token->token_start == (char *)0x0) || (token->delimiter_start != (char *)0x0)) {
    __ptr = get_delimiters_lengths(delimiters,n_delims);
    if (__ptr == (size_t *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
                  ,"get_next_token",0x52,1,"Failed to get delimiters lengths");
      }
      delimiters_lengths._4_4_ = 0x53;
    }
    else {
      pcVar3 = token->source + token->length;
      if (token->delimiter_start == (char *)0x0) {
        current_pos = token->source;
      }
      else {
        pcVar1 = token->delimiter_start;
        sVar4 = strlen(token->delimiter);
        current_pos = pcVar1 + sVar4;
      }
      delimiters_lengths._4_4_ = 0;
      for (stop_pos = current_pos; stop_pos < pcVar3; stop_pos = stop_pos + 1) {
        for (k = 0; k < n_delims; k = k + 1) {
          if (*stop_pos == *delimiters[k]) {
            for (local_60 = 1;
                (local_60 < __ptr[k] && stop_pos + local_60 < pcVar3 &&
                (stop_pos[local_60] == delimiters[k][local_60])); local_60 = local_60 + 1) {
            }
            if (local_60 == __ptr[k]) {
              token->delimiter_start = stop_pos;
              token->delimiter = delimiters[k];
              if (token->delimiter_start == token->source) {
                token->token_start = (char *)0x0;
              }
              else {
                token->token_start = current_pos;
              }
              goto LAB_0012049c;
            }
          }
        }
      }
      if (stop_pos == pcVar3) {
        token->token_start = current_pos;
        token->delimiter_start = (char *)0x0;
        token->delimiter = (char *)0x0;
      }
LAB_0012049c:
      free(__ptr);
    }
  }
  else {
    delimiters_lengths._4_4_ = 0x4a;
  }
  return delimiters_lengths._4_4_;
}

Assistant:

static int get_next_token(STRING_TOKEN* token, const char** delimiters, size_t n_delims)
{
    int result;

    if (token->token_start != NULL && token->delimiter_start == NULL)
    {
        // The parser reached the end of the input string.
        result = MU_FAILURE;
    }
    else
    {
        size_t* delimiters_lengths;

        if ((delimiters_lengths = get_delimiters_lengths(delimiters, n_delims)) == NULL)
        {
            LogError("Failed to get delimiters lengths");
            result = MU_FAILURE;
        }
        else
        {
            const char* new_token_start;
            const char* current_pos;
            const char* stop_pos = (char*)token->source + token->length;
            size_t j; // iterator for the delimiters.

            if (token->delimiter_start == NULL)
            {
                // Codes_SRS_STRING_TOKENIZER_09_005: [ The source string shall be split in a token starting from the beginning of source up to occurrence of any one of the demiliters, whichever occurs first in the order provided ]
                new_token_start = (char*)token->source;
            }
            else
            {
                // Codes_SRS_STRING_TOKENIZER_09_010: [ The next token shall be selected starting from the position in source right after the previous delimiter up to occurrence of any one of demiliters, whichever occurs first in the order provided ]
                new_token_start = token->delimiter_start + strlen(token->delimiter);
            }

            current_pos = new_token_start;
            result = 0;

            while (current_pos < stop_pos)
            {
                for (j = 0; j < n_delims; j++)
                {
                    if (*current_pos == *delimiters[j])
                    {
                        size_t k;
                        for (k = 1; k < delimiters_lengths[j] && (current_pos + k) < stop_pos; k++)
                        {
                            if (*(current_pos + k) != *(delimiters[j] + k))
                            {
                                break;
                            }
                        }

                        if (k == delimiters_lengths[j])
                        {
                            token->delimiter_start = current_pos;
                            token->delimiter = delimiters[j];

                            if (token->delimiter_start == token->source)
                            {
                                // Delimiter occurs in the beginning of the source string.
                                token->token_start = NULL;
                            }
                            else
                            {
                                token->token_start = new_token_start;
                            }
                            goto SCAN_COMPLETED;
                        }
                    }
                }

                current_pos++;
            }

            // Codes_SRS_STRING_TOKENIZER_09_006: [ If the source string does not have any of the demiliters, the resulting token shall be the entire source string ]
            // Codes_SRS_STRING_TOKENIZER_09_011: [ If the source string, starting right after the position of the last delimiter found, does not have any of the demiliters, the resulting token shall be the entire remaining of the source string ]
            if (current_pos == stop_pos)
            {
                token->token_start = new_token_start;
                token->delimiter_start = NULL;
                // Codes_SRS_STRING_TOKENIZER_09_019: [ If the current token extends to the end of source, the function shall return NULL ]
                token->delimiter = NULL;
            }

SCAN_COMPLETED:
            free(delimiters_lengths);
        }
    }

    return result;
}